

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

ON_2dex __thiscall
ON_NurbsSurface::ControlPointSpans(ON_NurbsSurface *this,int dir,int control_point_index)

{
  int control_point_index_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  if ((dir == 0) || (dir == 1)) {
    this_local = (ON_NurbsSurface *)
                 ON_BsplineControlPointSpans
                           (this->m_order[dir],this->m_cv_count[dir],control_point_index);
  }
  else {
    ON_2dex::ON_2dex((ON_2dex *)&this_local,0,0);
  }
  return (ON_2dex)this_local;
}

Assistant:

const ON_2dex ON_NurbsSurface::ControlPointSpans(int dir, int control_point_index) const
{
  if (0 == dir || 1 == dir)
    return ON_BsplineControlPointSpans(
      this->m_order[dir],
      this->m_cv_count[dir],
      control_point_index
    );
  return ON_2dex(0, 0);
}